

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError proto2num(OperationConfig *config,char **val,char **ostr,char *str)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  ParameterError PVar6;
  char **protoset;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  char **ppcVar14;
  dynbuf obuf;
  char buffer [32];
  
  curlx_dyn_init(&obuf,0x2c0);
  protoset = (char **)malloc(proto_count * 8 + 8);
  if (protoset == (char **)0x0) {
    PVar6 = PARAM_NO_MEM;
  }
  else {
    *protoset = (char *)0x0;
    for (; *val != (char *)0x0; val = val + 1) {
      pcVar7 = proto_token(*val);
      if (pcVar7 != (char *)0x0) {
        protoset_set(protoset,pcVar7);
      }
    }
    for (; cVar1 = *str, cVar1 != '\0'; str = str + 1) {
      pcVar7 = strchr(str,0x2c);
      if (pcVar7 == (char *)0x0) {
        sVar8 = strlen(str);
        pcVar12 = (char *)(sVar8 - 1);
LAB_0011a3fa:
        pcVar11 = str + 1;
        iVar13 = 0;
        if (cVar1 == '+') {
          bVar3 = false;
          bVar2 = false;
        }
        else if (cVar1 == '=') {
          bVar3 = true;
          bVar2 = false;
          iVar13 = 2;
        }
        else if (cVar1 == '-') {
          bVar2 = true;
          bVar3 = false;
          iVar13 = 1;
        }
        else {
          pcVar12 = pcVar12 + 1;
          bVar3 = false;
          bVar2 = false;
          iVar13 = 0;
          pcVar11 = str;
        }
        if ((pcVar12 == (char *)0x3) && (iVar4 = curl_strnequal(pcVar11,"all",3), iVar4 != 0)) {
          if (bVar2) {
            *protoset = (char *)0x0;
          }
          else {
            memcpy(protoset,built_in_protos,proto_count * 8 + 8);
          }
        }
        else {
          curl_msnprintf(buffer,0x20,"%.*s",(ulong)pcVar12 & 0xffffffff,pcVar11);
          pcVar12 = proto_token(buffer);
          if (pcVar12 == (char *)0x0) {
            if (bVar3) {
              *protoset = (char *)0x0;
            }
            warnf(config->global,"unrecognized protocol \'%s\'",buffer);
          }
          else {
            if (iVar13 != 0) {
              if (iVar13 != 2) {
                sVar10 = protoset_index(protoset,pcVar12);
                if (protoset[sVar10] != (char *)0x0) {
                  sVar9 = protoset_index(protoset,(char *)0x0);
                  protoset[sVar10] = protoset[sVar9 - 1];
                  protoset[sVar9 - 1] = (char *)0x0;
                }
                goto LAB_0011a550;
              }
              *protoset = (char *)0x0;
            }
            protoset_set(protoset,pcVar12);
          }
        }
LAB_0011a550:
        str = pcVar7;
        if (pcVar7 == (char *)0x0) break;
      }
      else if (str != pcVar7) {
        pcVar12 = pcVar7 + ~(ulong)str;
        goto LAB_0011a3fa;
      }
    }
    sVar10 = protoset_index(protoset,(char *)0x0);
    qsort(protoset,sVar10,8,struplocompare4sort);
    CVar5 = curlx_dyn_addn(&obuf,"",0);
    ppcVar14 = protoset;
    while ((*ppcVar14 != (char *)0x0 && (CVar5 == CURLE_OK))) {
      CVar5 = curlx_dyn_addf(&obuf,"%s,");
      ppcVar14 = ppcVar14 + 1;
    }
    free(protoset);
    sVar10 = curlx_dyn_len(&obuf);
    curlx_dyn_setlen(&obuf,sVar10 - 1);
    free(*ostr);
    pcVar7 = curlx_dyn_ptr(&obuf);
    *ostr = pcVar7;
    PVar6 = PARAM_NO_MEM;
    if (pcVar7 != (char *)0x0) {
      PVar6 = PARAM_OK;
    }
  }
  return PVar6;
}

Assistant:

ParameterError proto2num(struct OperationConfig *config,
                         const char * const *val, char **ostr, const char *str)
{
  const char **protoset;
  struct curlx_dynbuf obuf;
  size_t proto;
  CURLcode result;

  curlx_dyn_init(&obuf, MAX_PROTOSTRING);

  protoset = malloc((proto_count + 1) * sizeof(*protoset));
  if(!protoset)
    return PARAM_NO_MEM;

  /* Preset protocol set with default values. */
  protoset[0] = NULL;
  for(; *val; val++) {
    const char *p = proto_token(*val);

    if(p)
      protoset_set(protoset, p);
  }

  while(*str) {
    const char *next = strchr(str, ',');
    size_t plen;
    enum e_action { allow, deny, set } action = allow;

    if(next) {
      if(str == next) {
        str++;
        continue;
      }
      plen = next - str - 1;
    }
    else
      plen = strlen(str) - 1;

    /* Process token modifiers */
    switch(*str++) {
    case '=':
      action = set;
      break;
    case '-':
      action = deny;
      break;
    case '+':
      action = allow;
      break;
    default:
      /* no modifier */
      str--;
      plen++;
      break;
    }

    if((plen == 3) && curl_strnequal(str, "all", 3)) {
      switch(action) {
      case deny:
        protoset[0] = NULL;
        break;
      case allow:
      case set:
        memcpy((char *) protoset,
               built_in_protos, (proto_count + 1) * sizeof(*protoset));
        break;
      }
    }
    else {
      char buffer[32];
      const char *p;
      msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, str);

      p = proto_token(buffer);

      if(p)
        switch(action) {
        case deny:
          protoset_clear(protoset, p);
          break;
        case set:
          protoset[0] = NULL;
          FALLTHROUGH();
        case allow:
          protoset_set(protoset, p);
          break;
        }
      else { /* unknown protocol */
        /* If they have specified only this protocol, we say treat it as
           if no protocols are allowed */
        if(action == set)
          protoset[0] = NULL;
        warnf(config->global, "unrecognized protocol '%s'", buffer);
      }
    }
    if(next)
      str = next + 1;
    else
      break;
  }

  /* We need the protocols in alphabetic order for CI tests requirements. */
  qsort((char *) protoset, protoset_index(protoset, NULL), sizeof(*protoset),
        struplocompare4sort);

  result = curlx_dyn_addn(&obuf, "", 0);
  for(proto = 0; protoset[proto] && !result; proto++)
    result = curlx_dyn_addf(&obuf, "%s,", protoset[proto]);
  free((char *) protoset);
  curlx_dyn_setlen(&obuf, curlx_dyn_len(&obuf) - 1);
  free(*ostr);
  *ostr = curlx_dyn_ptr(&obuf);

  return *ostr ? PARAM_OK : PARAM_NO_MEM;
}